

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

void test_cpp_copy_map_iterator_to_different_map(void **param_1)

{
  int n;
  Roaring64MapSetBitBiDirectionalIterator it;
  Roaring64Map m2;
  Roaring64Map m1;
  int in_stack_fffffffffffffe5c;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  Roaring64MapSetBitBiDirectionalIterator *in_stack_fffffffffffffe68;
  unsigned_long in_stack_fffffffffffffe70;
  Roaring64Map *in_stack_fffffffffffffe80;
  initializer_list<unsigned_long> in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  int iVar1;
  Roaring64MapSetBitBiDirectionalIterator *this;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 *local_a0;
  undefined8 local_98;
  undefined8 local_58;
  undefined8 *local_50;
  undefined8 local_48;
  
  local_58 = 1;
  local_50 = &local_58;
  local_48 = 1;
  roaring::Roaring64Map::Roaring64Map(in_stack_fffffffffffffe80,in_stack_fffffffffffffe88);
  local_b8 = 0x1e;
  uStack_b0 = 0x28;
  local_c8 = 10;
  uStack_c0 = 0x14;
  local_a0 = &local_c8;
  local_98 = 4;
  roaring::Roaring64Map::Roaring64Map(in_stack_fffffffffffffe80,in_stack_fffffffffffffe88);
  roaring::Roaring64Map::begin
            ((Roaring64Map *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
  roaring::Roaring64Map::begin
            ((Roaring64Map *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
  this = (Roaring64MapSetBitBiDirectionalIterator *)0x15;
  roaring::Roaring64MapSetBitBiDirectionalIterator::move_equalorlarger
            ((Roaring64MapSetBitBiDirectionalIterator *)0x15,
             (value_type *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  iVar1 = 0;
  while( true ) {
    roaring::Roaring64Map::end
              ((Roaring64Map *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    in_stack_fffffffffffffe67 =
         roaring::Roaring64MapSetBitBiDirectionalIterator::operator!=
                   (this,(Roaring64MapSetBitBiDirectionalIterator *)
                         CONCAT44(iVar1,in_stack_fffffffffffffea0));
    if (!(bool)in_stack_fffffffffffffe67) break;
    roaring::Roaring64MapSetBitBiDirectionalIterator::operator++(in_stack_fffffffffffffe68);
    iVar1 = iVar1 + 1;
  }
  _assert_int_equal(in_stack_fffffffffffffe70,(unsigned_long)in_stack_fffffffffffffe68,
                    (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                    in_stack_fffffffffffffe5c);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x11293b);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x112948);
  return;
}

Assistant:

DEFINE_TEST(test_cpp_copy_map_iterator_to_different_map) {
    Roaring64Map m1{1};
    Roaring64Map m2{10, 20, 30, 40};
    auto it = m1.begin();
    it = m2.begin();
    it.move_equalorlarger(21);
    int n = 0;
    for (; it != m2.end(); ++it, ++n) {
    }
    assert_int_equal(2, n);
}